

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::
_preBegin__alpha____gles_texcombiner_commandAlpha_type
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  long lVar1;
  bool bVar2;
  alpha____gles_texcombiner_commandAlpha_type__AttributeData *paVar3;
  StringHash SVar4;
  long lVar5;
  xmlChar **ppxVar6;
  bool bVar7;
  float fVar8;
  bool failed;
  bool local_39;
  ParserTemplateBase *local_38;
  
  local_38 = (ParserTemplateBase *)this;
  paVar3 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::alpha____gles_texcombiner_commandAlpha_type__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar6 = attributes->attributes;
  if (ppxVar6 == (xmlChar **)0x0) {
    return true;
  }
LAB_006d8b38:
  do {
    while( true ) {
      while( true ) {
        text = *ppxVar6;
        bVar7 = text == (ParserChar *)0x0;
        if (bVar7) {
          return bVar7;
        }
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
        buffer = ppxVar6[1];
        ppxVar6 = ppxVar6 + 2;
        if (SVar4 != 0x799825) break;
        fVar8 = GeneratedSaxParser::Utils::toFloat(buffer,&failed);
        paVar3->scale = fVar8;
        if ((failed == true) &&
           (bVar7 = GeneratedSaxParser::ParserTemplateBase::handleError
                              (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                               0x6836e1,0x799825,buffer), bVar7)) {
          return false;
        }
        if ((failed & 1U) == 0) {
          *(byte *)&paVar3->present_attributes = (byte)paVar3->present_attributes | 1;
        }
      }
      if (SVar4 == 0x6c88e02) break;
      bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0x6836e1,text,
                         buffer);
      if (bVar2) {
        return bVar7;
      }
    }
    SVar4 = GeneratedSaxParser::Utils::calculateStringHash(buffer,&local_39);
    lVar1 = 0;
    do {
      lVar5 = lVar1;
      if (lVar5 + 0x10 == 0x70) {
        local_39 = true;
        paVar3->_operator = ENUM__gles_texcombiner_operatorAlpha_enums__COUNT;
        bVar7 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                           0x6836e1,0x6c88e02,buffer);
        if (bVar7) {
          return false;
        }
        goto LAB_006d8b38;
      }
      lVar1 = lVar5 + 0x10;
    } while (*(StringHash *)((long)&ENUM__gles_texcombiner_operatorAlpha_enumsMap + lVar5) != SVar4)
    ;
    paVar3->_operator = *(ENUM__gles_texcombiner_operatorAlpha_enums *)((long)&DAT_0086c688 + lVar5)
    ;
  } while( true );
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__alpha____gles_texcombiner_commandAlpha_type( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__alpha____gles_texcombiner_commandAlpha_type( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

alpha____gles_texcombiner_commandAlpha_type__AttributeData* attributeData = newData<alpha____gles_texcombiner_commandAlpha_type__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_operator:
    {
bool failed;
attributeData->_operator = Utils::toEnum<ENUM__gles_texcombiner_operatorAlpha_enums, StringHash, ENUM__gles_texcombiner_operatorAlpha_enums__COUNT>(attributeValue, failed, ENUM__gles_texcombiner_operatorAlpha_enumsMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_ALPHA,
        HASH_ATTRIBUTE_operator,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_scale:
    {
bool failed;
attributeData->scale = GeneratedSaxParser::Utils::toFloat(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_ALPHA,
        HASH_ATTRIBUTE_scale,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= alpha____gles_texcombiner_commandAlpha_type__AttributeData::ATTRIBUTE_SCALE_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_ALPHA, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}